

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleParamAssignment(TokenKind kind)

{
  short in_DI;
  undefined1 local_1;
  
  if (in_DI == 0x18 || in_DI == 0x19) {
    local_1 = true;
  }
  else {
    local_1 = isPossibleExpression(kind);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleParamAssignment(TokenKind kind) {
    // allow a comma here to handle cases like:  foo #(, 3);
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}